

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Oric.cpp
# Opt level: O3

void __thiscall
Oric::ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,(CPU::MOS6502Esque::Type)1>::
insert_media(ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,(CPU::MOS6502Esque::Type)1>
             *this)

{
  Media *in_RSI;
  
  ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,_(CPU::MOS6502Esque::Type)1>::
  insert_media((ConcreteMachine<(Analyser::Static::Oric::Target::DiskInterface)4,_(CPU::MOS6502Esque::Type)1>
                *)(this + -0x38),in_RSI);
  return;
}

Assistant:

bool insert_media(const Analyser::Static::Media &media) final {
			bool inserted = false;

			if(!media.tapes.empty()) {
				tape_player_.set_tape(media.tapes.front());
				inserted = true;
			}

			if(!media.disks.empty()) {
				switch(disk_interface) {
					case DiskInterface::BD500:		inserted |= insert_disks(media, bd500_, 4);		break;
					case DiskInterface::Jasmin:		inserted |= insert_disks(media, jasmin_, 4);	break;
					case DiskInterface::Microdisc:	inserted |= insert_disks(media, microdisc_, 4);	break;
					case DiskInterface::Pravetz:	inserted |= insert_disks(media, *diskii_.last_valid(), 2);	break;
					default: break;
				}
			}

			return inserted;
		}